

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

char * gen_filepath(int no,int nr)

{
  int nr_local;
  int no_local;
  
  if (no == 0) {
    _nr_local = "missing.xml";
  }
  else if (no == 1) {
    _nr_local = "<foo/>";
  }
  else if (no == 2) {
    _nr_local = "test/ent2";
  }
  else if (no == 3) {
    _nr_local = "test/valid/REC-xml-19980210.xml";
  }
  else if (no == 4) {
    _nr_local = "test/valid/dtds/xhtml1-strict.dtd";
  }
  else if (no == 5) {
    _nr_local = "http://localhost/";
  }
  else if (no == 6) {
    _nr_local = "http:http://http";
  }
  else {
    _nr_local = (char *)0x0;
  }
  return _nr_local;
}

Assistant:

static const char *gen_filepath(int no, int nr ATTRIBUTE_UNUSED) {
    if (no == 0) return("missing.xml");
    if (no == 1) return("<foo/>");
    if (no == 2) return("test/ent2");
    if (no == 3) return("test/valid/REC-xml-19980210.xml");
    if (no == 4) return("test/valid/dtds/xhtml1-strict.dtd");
    if (no == 5) return(REMOTE1GOOD);
    if (no == 6) return(REMOTE1BAD);
    return(NULL);
}